

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
fasttext::Model::initTableNegatives(Model *this,vector<long,_std::allocator<long>_> *counts)

{
  iterator __position;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer plVar3;
  pointer plVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  undefined1 auVar10 [64];
  float fVar11;
  undefined1 auVar12 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  float local_3c;
  int local_34;
  undefined1 extraout_var_00 [56];
  
  plVar3 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  plVar4 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (plVar4 == plVar3) {
    local_3c = 0.0;
  }
  else {
    local_3c = 0.0;
    uVar6 = 0;
    auVar12 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    do {
      auVar7._0_8_ = (double)plVar3[uVar6];
      auVar7._8_8_ = in_XMM4_Qb;
      if (auVar7._0_8_ < 0.0) {
        auVar12._0_8_ = sqrt(auVar7._0_8_);
        auVar12._8_56_ = extraout_var;
        auVar7 = auVar12._0_16_;
        auVar12 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      }
      else {
        auVar7 = vsqrtsd_avx(auVar7,auVar7);
      }
      auVar7 = vandpd_avx(auVar7,auVar12._0_16_);
      local_3c = (float)(auVar7._0_8_ + (double)local_3c);
      uVar6 = uVar6 + 1;
      plVar3 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      plVar4 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar6 < (ulong)((long)plVar4 - (long)plVar3 >> 3));
  }
  if (plVar4 != plVar3) {
    uVar6 = 0;
    do {
      auVar8._0_8_ = (double)plVar3[uVar6];
      auVar8._8_8_ = in_XMM4_Qb;
      if (auVar8._0_8_ < 0.0) {
        auVar10._0_8_ = sqrt(auVar8._0_8_);
        auVar10._8_56_ = extraout_var_00;
        auVar7 = auVar10._0_16_;
      }
      else {
        auVar7 = vsqrtsd_avx(auVar8,auVar8);
      }
      auVar9._0_4_ = (float)auVar7._0_8_;
      auVar9._4_12_ = auVar7._4_12_;
      auVar1._8_4_ = 0x7fffffff;
      auVar1._0_8_ = 0x7fffffff7fffffff;
      auVar1._12_4_ = 0x7fffffff;
      auVar7 = vandps_avx512vl(auVar9,auVar1);
      fVar11 = (auVar7._0_4_ * 1e+07) / local_3c;
      if (0.0 < fVar11) {
        lVar5 = 1;
        do {
          local_34 = (int)uVar6;
          __position._M_current =
               (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&this->negatives,__position,&local_34);
          }
          else {
            *__position._M_current = local_34;
            (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          auVar2._8_8_ = in_XMM4_Qb;
          auVar2._0_8_ = in_XMM4_Qa;
          auVar7 = vcvtusi2ss_avx512f(auVar2,lVar5);
          lVar5 = lVar5 + 1;
        } while (auVar7._0_4_ < fVar11);
      }
      uVar6 = uVar6 + 1;
      plVar3 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl
                                   .super__Vector_impl_data._M_finish - (long)plVar3 >> 3));
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->negatives).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,&this->rng);
  return;
}

Assistant:

void Model::initTableNegatives(const std::vector<int64_t>& counts) {
  real z = 0.0;
  for (size_t i = 0; i < counts.size(); i++) {
    z += pow(counts[i], 0.5);
  }
  for (size_t i = 0; i < counts.size(); i++) {
    real c = pow(counts[i], 0.5);
    for (size_t j = 0; j < c * NEGATIVE_TABLE_SIZE / z; j++) {
      negatives.push_back(i);
    }
  }
  std::shuffle(negatives.begin(), negatives.end(), rng);
}